

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::PipelineStateGLImpl::
PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
::HandleWaitingShaders
          (PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
           *this,bool WaitForCompletion)

{
  bool bVar1;
  bool bVar2;
  Char *pCVar3;
  TShaderStages *this_00;
  reference ppSVar4;
  char (*in_RCX) [33];
  undefined1 local_90 [8];
  string msg_1;
  SHADER_STATUS Status;
  ShaderGLImpl *pShaderGL;
  iterator __end0;
  iterator __begin0;
  TShaderStages *__range2;
  bool AllShaderReady;
  undefined1 local_38 [8];
  string msg;
  bool WaitForCompletion_local;
  PipelineBuilder<Diligent::GraphicsPipelineStateCreateInfo,_Diligent::GraphicsPipelineStateCreateInfoX>
  *this_local;
  
  msg.field_2._M_local_buf[0xf] = WaitForCompletion;
  if ((this->super_PipelineBuilderBase).m_State != WaitingShaders) {
    FormatString<char[26],char[33]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_State == State::WaitingShaders",in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"HandleWaitingShaders",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x158);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = true;
  this_00 = &(this->super_PipelineBuilderBase).m_Shaders;
  __end0 = std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::begin
                     (this_00);
  pShaderGL = (ShaderGLImpl *)
              std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>::end
                        (this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Diligent::ShaderGLImpl_**,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
                                *)&pShaderGL);
    if (!bVar2) {
      if (bVar1) {
        (this->super_PipelineBuilderBase).m_State = LinkingPrograms;
      }
      return;
    }
    ppSVar4 = __gnu_cxx::
              __normal_iterator<Diligent::ShaderGLImpl_**,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
              ::operator*(&__end0);
    msg_1.field_2._12_4_ =
         ShaderGLImpl::GetStatus(*ppSVar4,(bool)(msg.field_2._M_local_buf[0xf] & 1));
    if (msg_1.field_2._12_4_ == SHADER_STATUS_COMPILING) {
      bVar1 = false;
    }
    else if (msg_1.field_2._12_4_ != SHADER_STATUS_READY) {
      if (msg_1.field_2._12_4_ == SHADER_STATUS_FAILED) {
        (this->super_PipelineBuilderBase).m_State = Failed;
        return;
      }
      FormatString<char[25]>((string *)local_90,(char (*) [25])"Unexpected shader status");
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"HandleWaitingShaders",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0x16b);
      std::__cxx11::string::~string((string *)local_90);
    }
    __gnu_cxx::
    __normal_iterator<Diligent::ShaderGLImpl_**,_std::vector<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

void HandleWaitingShaders(bool WaitForCompletion)
    {
        VERIFY_EXPR(m_State == State::WaitingShaders);
        bool AllShaderReady = true;
        for (ShaderGLImpl* pShaderGL : m_Shaders)
        {
            SHADER_STATUS Status = pShaderGL->GetStatus(WaitForCompletion);
            switch (Status)
            {
                case SHADER_STATUS_COMPILING:
                    AllShaderReady = false;
                    break;

                case SHADER_STATUS_FAILED:
                    m_State = State::Failed;
                    return;

                case SHADER_STATUS_READY:
                    break;

                default:
                    UNEXPECTED("Unexpected shader status");
            }
        }

        if (AllShaderReady)
        {
            m_State = State::LinkingPrograms;
        }
    }